

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

void __thiscall
TPZTensor<double>::ComputeEigenvalues
          (TPZTensor<double> *this,TPZDecomposed *eigensystem,bool compute_eigenvectors)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  TPZVec<double> *this_00;
  TPZVec<TPZManVector<double,_3>_> *this_01;
  TPZManVector<double,_3> *pTVar7;
  uint *puVar8;
  TPZManVector<double,_3> *this_02;
  double *pdVar9;
  double *val2;
  uint *puVar10;
  byte in_DL;
  undefined4 *in_RSI;
  int equals_1;
  int different_1;
  bool ev1eqev2_1;
  bool ev0eqev1_1;
  TPZManVector<double,_3> temp_2;
  double eigenvalueTemp_2;
  TPZManVector<double,_3> temp_1;
  double eigenvalueTemp_1;
  TPZManVector<double,_3> temp;
  double eigenvalueTemp;
  int equals [2];
  int different;
  bool ev1eqev2;
  bool ev0eqev1;
  double tol;
  TPZManVector<TPZManVector<double,_3>,_3> *eigenvectors;
  TPZManVector<double,_3> *eigenvalues;
  double in_stack_fffffffffffffc18;
  TPZManVector<double,_3> *in_stack_fffffffffffffc20;
  TPZTensor<double> *in_stack_fffffffffffffc28;
  TPZTensor<double> *in_stack_fffffffffffffc30;
  TPZTensor<double> *in_stack_fffffffffffffc38;
  TPZManVector<double,_3> *in_stack_fffffffffffffc40;
  TPZManVector<double,_3> *this_03;
  TPZManVector<double,_3> *in_stack_fffffffffffffc48;
  TPZTensor<double> *in_stack_fffffffffffffc50;
  int local_29c;
  int local_298;
  uint local_1d0;
  int iStack_1cc;
  uint local_1c8;
  undefined8 in_stack_ffffffffffffff00;
  undefined1 compute_eigenvectors_00;
  TPZDecomposed *in_stack_ffffffffffffff08;
  TPZTensor<double> *in_stack_ffffffffffffff10;
  
  compute_eigenvectors_00 = (undefined1)((ulong)in_stack_ffffffffffffff00 >> 0x38);
  bVar3 = in_DL & 1;
  this_00 = (TPZVec<double> *)(in_RSI + 0xe);
  this_01 = (TPZVec<TPZManVector<double,_3>_> *)(in_RSI + 0x1c);
  Norm(in_stack_fffffffffffffc50);
  bVar4 = IsZeroTensor(in_stack_fffffffffffffc38,(double)in_stack_fffffffffffffc30);
  if (bVar4) {
    *in_RSI = 1;
    pdVar9 = TPZVec<double>::operator[](this_00,2);
    *pdVar9 = 0.0;
    pdVar9 = TPZVec<double>::operator[](this_00,1);
    *pdVar9 = 0.0;
    pdVar9 = TPZVec<double>::operator[](this_00,0);
    *pdVar9 = 0.0;
    puVar10 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),0);
    *puVar10 = 3;
    puVar10 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),1);
    *puVar10 = 3;
    puVar10 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),2);
    *puVar10 = 3;
    if (bVar3 == 0) {
      return;
    }
    TPZManVector<double,_3>::TPZManVector
              ((TPZManVector<double,_3> *)in_stack_fffffffffffffc50,
               (int64_t)in_stack_fffffffffffffc48,(double *)in_stack_fffffffffffffc40);
    TPZVec<TPZManVector<double,_3>_>::operator[](this_01,0);
    TPZManVector<double,_3>::operator=
              (in_stack_fffffffffffffc40,(TPZManVector<double,_3> *)in_stack_fffffffffffffc38);
    TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffc20);
    pTVar7 = TPZVec<TPZManVector<double,_3>_>::operator[](this_01,0);
    pdVar9 = TPZVec<double>::operator[](&pTVar7->super_TPZVec<double>,0);
    *pdVar9 = 1.0;
    TPZManVector<double,_3>::TPZManVector
              ((TPZManVector<double,_3> *)in_stack_fffffffffffffc50,
               (int64_t)in_stack_fffffffffffffc48,(double *)in_stack_fffffffffffffc40);
    TPZVec<TPZManVector<double,_3>_>::operator[](this_01,1);
    TPZManVector<double,_3>::operator=
              (in_stack_fffffffffffffc40,(TPZManVector<double,_3> *)in_stack_fffffffffffffc38);
    TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffc20);
    pTVar7 = TPZVec<TPZManVector<double,_3>_>::operator[](this_01,1);
    pdVar9 = TPZVec<double>::operator[](&pTVar7->super_TPZVec<double>,1);
    *pdVar9 = 1.0;
    TPZManVector<double,_3>::TPZManVector
              ((TPZManVector<double,_3> *)in_stack_fffffffffffffc50,
               (int64_t)in_stack_fffffffffffffc48,(double *)in_stack_fffffffffffffc40);
    TPZVec<TPZManVector<double,_3>_>::operator[](this_01,2);
    TPZManVector<double,_3>::operator=
              (in_stack_fffffffffffffc40,(TPZManVector<double,_3> *)in_stack_fffffffffffffc38);
    TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffc20);
    pTVar7 = TPZVec<TPZManVector<double,_3>_>::operator[](this_01,2);
    pdVar9 = TPZVec<double>::operator[](&pTVar7->super_TPZVec<double>,2);
    *pdVar9 = 1.0;
    return;
  }
  bVar4 = IsDiagonal(in_stack_fffffffffffffc28,(double)in_stack_fffffffffffffc20);
  if (!bVar4) {
    DirectEigenValues(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                      (bool)compute_eigenvectors_00);
    pdVar9 = TPZVec<double>::operator[](this_00,0);
    TPZVec<double>::operator[](this_00,1);
    bVar4 = AreEqual(in_stack_fffffffffffffc30,(double *)in_stack_fffffffffffffc28,
                     (double *)in_stack_fffffffffffffc20,(double)pdVar9);
    val2 = TPZVec<double>::operator[](this_00,1);
    TPZVec<double>::operator[](this_00,2);
    bVar6 = AreEqual(in_stack_fffffffffffffc30,(double *)in_stack_fffffffffffffc28,val2,
                     (double)pdVar9);
    if ((bVar4) && (bVar6)) {
      *in_RSI = 1;
      puVar10 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),0);
      *puVar10 = 3;
      puVar10 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),1);
      *puVar10 = 3;
      puVar10 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),2);
      *puVar10 = 3;
      return;
    }
    if ((!bVar4) && (!bVar6)) {
      *in_RSI = 3;
      puVar10 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),0);
      *puVar10 = 1;
      puVar10 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),1);
      *puVar10 = 1;
      puVar10 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),2);
      *puVar10 = 1;
      return;
    }
    *in_RSI = 2;
    if (bVar4) {
      local_298 = 2;
      local_29c = 0;
    }
    else {
      local_298 = 0;
      local_29c = 2;
    }
    puVar10 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),1);
    *puVar10 = 2;
    puVar10 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),(long)local_29c)
    ;
    *puVar10 = 2;
    puVar10 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),(long)local_298)
    ;
    *puVar10 = 1;
    return;
  }
  pdVar9 = XX((TPZTensor<double> *)0x14a68da);
  dVar1 = *pdVar9;
  pdVar9 = TPZVec<double>::operator[](this_00,0);
  *pdVar9 = dVar1;
  pdVar9 = YY((TPZTensor<double> *)0x14a6912);
  dVar1 = *pdVar9;
  pdVar9 = TPZVec<double>::operator[](this_00,1);
  *pdVar9 = dVar1;
  pdVar9 = ZZ((TPZTensor<double> *)0x14a694b);
  dVar1 = *pdVar9;
  pdVar9 = TPZVec<double>::operator[](this_00,2);
  *pdVar9 = dVar1;
  if (bVar3 != 0) {
    (*this_01->_vptr_TPZVec[4])();
    TPZManVector<double,_3>::TPZManVector
              ((TPZManVector<double,_3> *)in_stack_fffffffffffffc50,
               (int64_t)in_stack_fffffffffffffc48,(double *)in_stack_fffffffffffffc40);
    TPZVec<TPZManVector<double,_3>_>::operator[](this_01,0);
    TPZManVector<double,_3>::operator=
              (in_stack_fffffffffffffc40,(TPZManVector<double,_3> *)in_stack_fffffffffffffc38);
    TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffc20);
    pTVar7 = TPZVec<TPZManVector<double,_3>_>::operator[](this_01,0);
    pdVar9 = TPZVec<double>::operator[](&pTVar7->super_TPZVec<double>,0);
    *pdVar9 = 1.0;
    TPZManVector<double,_3>::TPZManVector
              ((TPZManVector<double,_3> *)in_stack_fffffffffffffc50,
               (int64_t)in_stack_fffffffffffffc48,(double *)in_stack_fffffffffffffc40);
    TPZVec<TPZManVector<double,_3>_>::operator[](this_01,1);
    TPZManVector<double,_3>::operator=
              (in_stack_fffffffffffffc40,(TPZManVector<double,_3> *)in_stack_fffffffffffffc38);
    TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffc20);
    pTVar7 = TPZVec<TPZManVector<double,_3>_>::operator[](this_01,1);
    pdVar9 = TPZVec<double>::operator[](&pTVar7->super_TPZVec<double>,1);
    *pdVar9 = 1.0;
    TPZManVector<double,_3>::TPZManVector
              ((TPZManVector<double,_3> *)in_stack_fffffffffffffc50,
               (int64_t)in_stack_fffffffffffffc48,(double *)in_stack_fffffffffffffc40);
    TPZVec<TPZManVector<double,_3>_>::operator[](this_01,2);
    TPZManVector<double,_3>::operator=
              (in_stack_fffffffffffffc40,(TPZManVector<double,_3> *)in_stack_fffffffffffffc38);
    TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffc20);
    pTVar7 = TPZVec<TPZManVector<double,_3>_>::operator[](this_01,2);
    pdVar9 = TPZVec<double>::operator[](&pTVar7->super_TPZVec<double>,2);
    *pdVar9 = 1.0;
  }
  TPZVec<double>::operator[](this_00,0);
  TPZVec<double>::operator[](this_00,1);
  bVar4 = AreEqual(in_stack_fffffffffffffc30,(double *)in_stack_fffffffffffffc28,
                   (double *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  TPZVec<double>::operator[](this_00,1);
  TPZVec<double>::operator[](this_00,2);
  bVar6 = AreEqual(in_stack_fffffffffffffc30,(double *)in_stack_fffffffffffffc28,
                   (double *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  if ((bVar4) && (bVar6)) {
    *in_RSI = 1;
    puVar10 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),0);
    *puVar10 = 3;
    puVar10 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),1);
    *puVar10 = 3;
    puVar10 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),2);
    *puVar10 = 3;
    return;
  }
  if ((!bVar4) && (!bVar6)) {
    TPZVec<double>::operator[](this_00,0);
    TPZVec<double>::operator[](this_00,2);
    bVar5 = AreEqual(in_stack_fffffffffffffc30,(double *)in_stack_fffffffffffffc28,
                     (double *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    if (!bVar5) {
      *in_RSI = 3;
      puVar10 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),0);
      *puVar10 = 1;
      puVar10 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),1);
      *puVar10 = 1;
      puVar10 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),2);
      *puVar10 = 1;
      goto LAB_014a6ed6;
    }
  }
  *in_RSI = 2;
  if (bVar4) {
    local_1c8 = 2;
    local_1d0 = 0;
    iStack_1cc = 1;
  }
  else {
    local_1d0 = (uint)bVar6;
    local_1c8 = (uint)!bVar6;
    iStack_1cc = 2;
  }
  puVar10 = TPZVec<unsigned_int>::operator[]
                      ((TPZVec<unsigned_int> *)(in_RSI + 2),(long)(int)local_1c8);
  *puVar10 = 1;
  puVar10 = TPZVec<unsigned_int>::operator[]
                      ((TPZVec<unsigned_int> *)(in_RSI + 2),(long)(int)local_1d0);
  *puVar10 = 2;
  puVar10 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),(long)iStack_1cc);
  *puVar10 = 2;
LAB_014a6ed6:
  pdVar9 = TPZVec<double>::operator[](this_00,0);
  dVar1 = *pdVar9;
  pdVar9 = TPZVec<double>::operator[](this_00,1);
  if (dVar1 < *pdVar9) {
    pdVar9 = TPZVec<double>::operator[](this_00,0);
    dVar1 = *pdVar9;
    pdVar9 = TPZVec<double>::operator[](this_00,1);
    dVar2 = *pdVar9;
    pdVar9 = TPZVec<double>::operator[](this_00,0);
    *pdVar9 = dVar2;
    pdVar9 = TPZVec<double>::operator[](this_00,1);
    *pdVar9 = dVar1;
    puVar10 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),0);
    puVar8 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),1);
    std::swap<unsigned_int>(puVar10,puVar8);
    if (bVar3 != 0) {
      TPZVec<TPZManVector<double,_3>_>::operator[](this_01,0);
      TPZManVector<double,_3>::TPZManVector
                ((TPZManVector<double,_3> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      TPZVec<TPZManVector<double,_3>_>::operator[](this_01,1);
      TPZVec<TPZManVector<double,_3>_>::operator[](this_01,0);
      TPZManVector<double,_3>::operator=
                (in_stack_fffffffffffffc40,(TPZManVector<double,_3> *)in_stack_fffffffffffffc38);
      TPZVec<TPZManVector<double,_3>_>::operator[](this_01,1);
      TPZManVector<double,_3>::operator=
                (in_stack_fffffffffffffc40,(TPZManVector<double,_3> *)in_stack_fffffffffffffc38);
      TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffc20);
    }
  }
  pdVar9 = TPZVec<double>::operator[](this_00,1);
  dVar1 = *pdVar9;
  pdVar9 = TPZVec<double>::operator[](this_00,2);
  if (dVar1 < *pdVar9) {
    pdVar9 = TPZVec<double>::operator[](this_00,1);
    dVar1 = *pdVar9;
    pdVar9 = TPZVec<double>::operator[](this_00,2);
    dVar2 = *pdVar9;
    pdVar9 = TPZVec<double>::operator[](this_00,1);
    *pdVar9 = dVar2;
    pdVar9 = TPZVec<double>::operator[](this_00,2);
    *pdVar9 = dVar1;
    puVar10 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),1);
    puVar8 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),2);
    std::swap<unsigned_int>(puVar10,puVar8);
    if (bVar3 != 0) {
      TPZVec<TPZManVector<double,_3>_>::operator[](this_01,1);
      TPZManVector<double,_3>::TPZManVector
                ((TPZManVector<double,_3> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      TPZVec<TPZManVector<double,_3>_>::operator[](this_01,2);
      TPZVec<TPZManVector<double,_3>_>::operator[](this_01,1);
      TPZManVector<double,_3>::operator=
                (in_stack_fffffffffffffc40,(TPZManVector<double,_3> *)in_stack_fffffffffffffc38);
      TPZVec<TPZManVector<double,_3>_>::operator[](this_01,2);
      TPZManVector<double,_3>::operator=
                (in_stack_fffffffffffffc40,(TPZManVector<double,_3> *)in_stack_fffffffffffffc38);
      TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffc20);
    }
  }
  pdVar9 = TPZVec<double>::operator[](this_00,0);
  dVar1 = *pdVar9;
  pdVar9 = TPZVec<double>::operator[](this_00,1);
  if (dVar1 < *pdVar9) {
    pdVar9 = TPZVec<double>::operator[](this_00,0);
    pTVar7 = (TPZManVector<double,_3> *)*pdVar9;
    pdVar9 = TPZVec<double>::operator[](this_00,1);
    this_03 = (TPZManVector<double,_3> *)*pdVar9;
    pdVar9 = TPZVec<double>::operator[](this_00,0);
    *pdVar9 = (double)this_03;
    pdVar9 = TPZVec<double>::operator[](this_00,1);
    *pdVar9 = (double)pTVar7;
    this_02 = (TPZManVector<double,_3> *)
              TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),0);
    puVar10 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RSI + 2),1);
    std::swap<unsigned_int>((uint *)this_02,puVar10);
    if (bVar3 != 0) {
      TPZVec<TPZManVector<double,_3>_>::operator[](this_01,0);
      TPZManVector<double,_3>::TPZManVector(this_02,pTVar7);
      pTVar7 = TPZVec<TPZManVector<double,_3>_>::operator[](this_01,1);
      TPZVec<TPZManVector<double,_3>_>::operator[](this_01,0);
      TPZManVector<double,_3>::operator=(this_03,pTVar7);
      TPZVec<TPZManVector<double,_3>_>::operator[](this_01,1);
      TPZManVector<double,_3>::operator=(this_03,pTVar7);
      TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffc20);
    }
  }
  return;
}

Assistant:

void TPZTensor<T>::ComputeEigenvalues(TPZDecomposed &eigensystem, const bool compute_eigenvectors) const {
    TPZManVector<T, 3> &eigenvalues = eigensystem.fEigenvalues;
    TPZManVector<TPZManVector<T, 3>, 3> &eigenvectors = eigensystem.fEigenvectors;

    T tol = Norm()*1.e-12;

    if (this->IsZeroTensor(tol)) {
        eigensystem.fDistinctEigenvalues = 1;
        eigenvalues[0] = eigenvalues[1] = eigenvalues[2] = 0.;
        eigensystem.fGeometricMultiplicity[0] = 3;
        eigensystem.fGeometricMultiplicity[1] = 3;
        eigensystem.fGeometricMultiplicity[2] = 3;
        if (compute_eigenvectors) {
            eigenvectors[0] = TPZManVector<T, 3>(3, 0.);
            eigenvectors[0][0] = 1.0;
            eigenvectors[1] = TPZManVector<T, 3>(3, 0.);
            eigenvectors[1][1] = 1.0;
            eigenvectors[2] = TPZManVector<T, 3>(3, 0.);
            eigenvectors[2][2] = 1.0;
        }
    } else if (this->IsDiagonal(tol)) {
        eigenvalues[0] = this->XX();
        eigenvalues[1] = this->YY();
        eigenvalues[2] = this->ZZ();

        if (compute_eigenvectors) {
            eigenvectors.resize(3);
            eigenvectors[0] = TPZManVector<T, 3>(3, 0.);
            eigenvectors[0][0] = 1.0;
            eigenvectors[1] = TPZManVector<T, 3>(3, 0.);
            eigenvectors[1][1] = 1.0;
            eigenvectors[2] = TPZManVector<T, 3>(3, 0.);
            eigenvectors[2][2] = 1.0;
        }

        bool ev0eqev1 = AreEqual(eigenvalues[0], eigenvalues[1], tol);
        bool ev1eqev2 = AreEqual(eigenvalues[1], eigenvalues[2], tol);

        if (ev0eqev1 && ev1eqev2) {
            //tres autovalores iguais
            eigensystem.fDistinctEigenvalues = 1;
            eigensystem.fGeometricMultiplicity[0] = 3;
            eigensystem.fGeometricMultiplicity[1] = 3;
            eigensystem.fGeometricMultiplicity[2] = 3;
            return;
        } else if (ev0eqev1 || ev1eqev2 || AreEqual(eigenvalues[0], eigenvalues[2], tol)) {
            eigensystem.fDistinctEigenvalues = 2;
            int different = -1;
            int equals[2] = {-1, -1};
            if (ev0eqev1) {
                different = 2;
                equals[0] = 0;
                equals[1] = 1;
            } else if (ev1eqev2) {
                different = 0;
                equals[0] = 1;
                equals[1] = 2;
            } else {
                different = 1;
                equals[0] = 0;
                equals[1] = 2;
            }
            eigensystem.fGeometricMultiplicity[different] = 1;
            eigensystem.fGeometricMultiplicity[equals[0]] = 2;
            eigensystem.fGeometricMultiplicity[equals[1]] = 2;
        } else {
            eigensystem.fDistinctEigenvalues = 3;
            eigensystem.fGeometricMultiplicity[0] = 1;
            eigensystem.fGeometricMultiplicity[1] = 1;
            eigensystem.fGeometricMultiplicity[2] = 1;
        }

        if (eigenvalues[0] < eigenvalues[1]) {
            T eigenvalueTemp = eigenvalues[0];
            eigenvalues[0] = eigenvalues[1];
            eigenvalues[1] = eigenvalueTemp;
            std::swap(eigensystem.fGeometricMultiplicity[0], eigensystem.fGeometricMultiplicity[1]);
            if (compute_eigenvectors) {
                auto temp = eigenvectors[0];
                eigenvectors[0] = eigenvectors[1];
                eigenvectors[1] = temp;
            }
        }
        if (eigenvalues[1] < eigenvalues[2]) {
            T eigenvalueTemp = eigenvalues[1];
            eigenvalues[1] = eigenvalues[2];
            eigenvalues[2] = eigenvalueTemp;
            std::swap(eigensystem.fGeometricMultiplicity[1], eigensystem.fGeometricMultiplicity[2]);
            if (compute_eigenvectors) {
                auto temp = eigenvectors[1];
                eigenvectors[1] = eigenvectors[2];
                eigenvectors[2] = temp;
            }
        }
        if (eigenvalues[0] < eigenvalues[1]) {
            T eigenvalueTemp = eigenvalues[0];
            eigenvalues[0] = eigenvalues[1];
            eigenvalues[1] = eigenvalueTemp;
            std::swap(eigensystem.fGeometricMultiplicity[0], eigensystem.fGeometricMultiplicity[1]);
            if (compute_eigenvectors) {
                auto temp = eigenvectors[0];
                eigenvectors[0] = eigenvectors[1];
                eigenvectors[1] = temp;
            }
        }
    } else {
        this->DirectEigenValues(eigensystem, compute_eigenvectors);

        bool ev0eqev1 = AreEqual(eigenvalues[0], eigenvalues[1], tol);
        bool ev1eqev2 = AreEqual(eigenvalues[1], eigenvalues[2], tol);
        //tres autovalores iguais
        if (ev0eqev1 && ev1eqev2) {
            eigensystem.fDistinctEigenvalues = 1;
            eigensystem.fGeometricMultiplicity[0] = 3;
            eigensystem.fGeometricMultiplicity[1] = 3;
            eigensystem.fGeometricMultiplicity[2] = 3;
        } else if (ev0eqev1 || ev1eqev2) {
            //dois autovalores iguais
            eigensystem.fDistinctEigenvalues = 2;

            int different = -1;
            int equals = -1;
            if (ev0eqev1) {
                different = 2;
                equals = 0;
            } else {
                different = 0;
                equals = 2;
            }
            eigensystem.fGeometricMultiplicity[1] = 2;
            eigensystem.fGeometricMultiplicity[equals] = 2;
            eigensystem.fGeometricMultiplicity[different] = 1;
        } else {
            //3 autovalores diferentes
            eigensystem.fDistinctEigenvalues = 3;
            eigensystem.fGeometricMultiplicity[0] = 1;
            eigensystem.fGeometricMultiplicity[1] = 1;
            eigensystem.fGeometricMultiplicity[2] = 1;
        }
    }
}